

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int textureTarget,int mipLevel
          ,int imageIndex)

{
  ostream *poVar1;
  int iVar2;
  undefined1 local_198 [8];
  ostringstream result;
  int imageIndex_local;
  int mipLevel_local;
  int textureTarget_local;
  
  iVar2 = (int)this;
  result._372_4_ = mipLevel;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"level ");
  std::ostream::operator<<(local_198,textureTarget);
  if (iVar2 != 0xde1) {
    if (iVar2 == 0x806f) {
      poVar1 = std::operator<<((ostream *)local_198," and Slice ");
      std::ostream::operator<<(poVar1,result._372_4_);
    }
    else if (iVar2 == 0x8513) {
      poVar1 = std::operator<<((ostream *)local_198," and Face ");
      std::ostream::operator<<(poVar1,result._372_4_);
    }
    else if (iVar2 == 0x8c1a) {
      poVar1 = std::operator<<((ostream *)local_198," and Layer ");
      std::ostream::operator<<(poVar1,result._372_4_);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string getTextureImageDescription (int textureTarget, int mipLevel, int imageIndex)
{
	std::ostringstream result;
	result << "level ";
	result << mipLevel;

	switch (textureTarget)
	{
		case GL_TEXTURE_2D:			break;
		case GL_TEXTURE_3D:			result << " and Slice " << imageIndex; break;
		case GL_TEXTURE_CUBE_MAP:	result << " and Face " << imageIndex; break;
		case GL_TEXTURE_2D_ARRAY:	result << " and Layer " << imageIndex; break;
		default:
			DE_FATAL("Unsupported texture target");
			break;
	}
	return result.str();
}